

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

bool __thiscall QCss::Parser::parseSelector(Parser *this,Selector *sel)

{
  bool bVar1;
  BasicSelector *in_RDI;
  long in_FS_OFFSET;
  BasicSelector basicSel;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  bool local_d9;
  BasicSelector *in_stack_ffffffffffffff30;
  Parser *in_stack_ffffffffffffff38;
  undefined1 local_70 [104];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_70,0xaa,0x68);
  BasicSelector::BasicSelector(in_RDI);
  bVar1 = parseSimpleSelector(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  if (bVar1) {
    do {
      bVar1 = testCombinator((Parser *)in_RDI);
      if (!bVar1) {
LAB_00a3c2cf:
        QList<QCss::BasicSelector>::append
                  ((QList<QCss::BasicSelector> *)in_RDI,
                   (parameter_type)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
        local_d9 = true;
        goto LAB_00a3c2ee;
      }
      bVar1 = parseCombinator((Parser *)in_RDI,
                              (Relation *)
                              CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
      if (!bVar1) {
        local_d9 = false;
        goto LAB_00a3c2ee;
      }
      bVar1 = testSimpleSelector((Parser *)in_RDI);
      if (!bVar1) goto LAB_00a3c2cf;
      QList<QCss::BasicSelector>::append
                ((QList<QCss::BasicSelector> *)in_RDI,
                 (parameter_type)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
      BasicSelector::BasicSelector(in_RDI);
      BasicSelector::operator=
                (in_RDI,(BasicSelector *)
                        CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
      BasicSelector::~BasicSelector(in_RDI);
      bVar1 = parseSimpleSelector(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    } while (bVar1);
    local_d9 = false;
  }
  else {
    local_d9 = false;
  }
LAB_00a3c2ee:
  BasicSelector::~BasicSelector(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_d9;
}

Assistant:

bool Parser::parseSelector(Selector *sel)
{
    BasicSelector basicSel;
    if (!parseSimpleSelector(&basicSel)) return false;
    while (testCombinator()) {
        if (!parseCombinator(&basicSel.relationToNext)) return false;

        if (!testSimpleSelector()) break;
        sel->basicSelectors.append(basicSel);

        basicSel = BasicSelector();
        if (!parseSimpleSelector(&basicSel)) return false;
    }
    sel->basicSelectors.append(basicSel);
    return true;
}